

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O3

Abc_Cex_t * Bmc_CexCareExtendToObjects(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Abc_Cex_t *pAVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Int_t *pVVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  
  if (pCex->nPis != pCexCare->nPis) {
    __assert_fail("pCex->nPis == pCexCare->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x33,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  if (pCex->nRegs != pCexCare->nRegs) {
    __assert_fail("pCex->nRegs == pCexCare->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x34,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  if (pCex->nBits != pCexCare->nBits) {
    __assert_fail("pCex->nBits == pCexCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x35,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  pAVar4 = Abc_CexAlloc(pCex->nRegs,p->nObjs,pCex->iFrame + 1);
  iVar8 = pCex->iFrame;
  pAVar4->iPo = pCex->iPo;
  pAVar4->iFrame = iVar8;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  iVar8 = p->nRegs;
  if (0 < iVar8) {
    iVar9 = 0;
    do {
      iVar7 = p->vCos->nSize;
      uVar14 = (iVar7 - iVar8) + iVar9;
      if (((int)uVar14 < 0) || (iVar7 <= (int)uVar14)) goto LAB_0057a902;
      iVar7 = p->vCos->pArray[uVar14];
      lVar11 = (long)iVar7;
      if ((lVar11 < 0) || (p->nObjs <= iVar7)) goto LAB_0057a8e3;
      pGVar13 = p->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar13 + lVar11) = *(ulong *)(pGVar13 + lVar11) & 0xbfffffffbfffffff | 0x40000000;
      iVar9 = iVar9 + 1;
      iVar8 = p->nRegs;
    } while (iVar9 < iVar8);
  }
  uVar10 = 0x4000000000000000;
  if (pCex->iFrame < 0) {
    pVVar16 = p->vCos;
  }
  else {
    iVar8 = 0;
    do {
      iVar9 = p->nRegs;
      pVVar16 = p->vCis;
      iVar7 = pVVar16->nSize;
      if (iVar9 < iVar7) {
        lVar11 = 0;
        do {
          if (iVar7 <= lVar11) goto LAB_0057a902;
          iVar7 = pVVar16->pArray[lVar11];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0057a8e3;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar13 = p->pObjs + iVar7;
          uVar14 = pCexCare->nPis * iVar8 + pCexCare->nRegs + (int)lVar11;
          if (((uint)(&pCexCare[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) == 0) {
            uVar17 = *(ulong *)pGVar13 | 0x4000000040000000;
          }
          else {
            uVar14 = pCex->nPis * iVar8 + pCex->nRegs + (int)lVar11;
            if (((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) == 0) {
              uVar17 = *(ulong *)pGVar13 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar17 = *(ulong *)pGVar13 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
          }
          *(ulong *)pGVar13 = uVar17;
          lVar11 = lVar11 + 1;
          iVar9 = p->nRegs;
          pVVar16 = p->vCis;
          iVar7 = pVVar16->nSize;
        } while (lVar11 < iVar7 - iVar9);
      }
      if (0 < iVar9) {
        iVar7 = 0;
        do {
          iVar1 = p->vCis->nSize;
          uVar14 = iVar7 + (iVar1 - iVar9);
          if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_0057a902;
          iVar2 = p->vCis->pArray[uVar14];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0057a8e3;
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          pGVar12 = pGVar13 + iVar2;
          uVar17 = *(ulong *)pGVar12;
          if (((~(uint)uVar17 & 0x9fffffff) != 0) ||
             (uVar14 = (uint)(uVar17 >> 0x20) & 0x1fffffff, (int)uVar14 < iVar1 - iVar9)) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar9 = p->vCos->nSize;
          uVar14 = (iVar9 - iVar1) + uVar14;
          if (((int)uVar14 < 0) || (iVar9 <= (int)uVar14)) goto LAB_0057a902;
          uVar14 = p->vCos->pArray[uVar14];
          lVar11 = (long)(int)uVar14;
          if ((lVar11 < 0) || ((uint)p->nObjs <= uVar14)) goto LAB_0057a8e3;
          if ((*(ulong *)(pGVar13 + lVar11) & 0x4000000040000000) == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3b4,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar15 = *(ulong *)(pGVar13 + lVar11) & 0x40000000;
          *(ulong *)pGVar12 = uVar17 & 0xffffffffbfffffff | uVar15;
          *(ulong *)pGVar12 =
               uVar17 & 0xbfffffffbfffffff | uVar15 |
               *(ulong *)(pGVar13 + lVar11) & 0x4000000000000000;
          iVar7 = iVar7 + 1;
          iVar9 = p->nRegs;
        } while (iVar7 < iVar9);
      }
      iVar9 = p->nObjs;
      if (0 < iVar9) {
        lVar11 = 0;
        lVar18 = 0;
        do {
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          uVar17 = *(ulong *)(&pGVar13->field_0x0 + lVar11);
          uVar14 = (uint)uVar17;
          if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            uVar15 = *(ulong *)((long)pGVar13 +
                               lVar11 + (ulong)(uint)((int)(uVar17 & 0x1fffffff) << 2) * -3) &
                     0x4000000040000000;
            if (uVar15 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x39c,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar19 = *(ulong *)((long)pGVar13 +
                               lVar11 + (ulong)((uint)(uVar17 >> 0x1e) & 0x7ffffffc) * -3) &
                     0x4000000040000000;
            if (uVar19 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x39d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar5 = uVar10;
            if ((uVar14 >> 0x1d & 1) == 0) {
              uVar5 = 0x40000000;
            }
            if (uVar15 == uVar5) {
LAB_0057a6b3:
              uVar17 = uVar17 & 0xbfffffff3fffffff | 0x40000000;
            }
            else {
              uVar5 = uVar10;
              if ((uVar17 >> 0x3d & 1) == 0) {
                uVar5 = 0x40000000;
              }
              if (uVar19 == uVar5) goto LAB_0057a6b3;
              uVar5 = 0x40000000;
              if ((uVar14 >> 0x1d & 1) == 0) {
                uVar5 = uVar10;
              }
              uVar6 = 0x40000000;
              if ((uVar17 >> 0x3d & 1) == 0) {
                uVar6 = uVar10;
              }
              if ((uVar15 == uVar5) && (uVar19 == uVar6)) {
                uVar17 = uVar17 & 0xbfffffff3fffffff | 0x4000000000000000;
              }
              else {
                uVar17 = uVar17 | 0x4000000040000000;
              }
            }
            *(ulong *)(&pGVar13->field_0x0 + lVar11) = uVar17;
            iVar9 = p->nObjs;
          }
          lVar18 = lVar18 + 1;
          lVar11 = lVar11 + 0xc;
        } while (lVar18 < iVar9);
      }
      pVVar16 = p->vCos;
      if (0 < pVVar16->nSize) {
        lVar11 = 0;
        do {
          iVar9 = pVVar16->pArray[lVar11];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0057a8e3;
          if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0057a869;
          pGVar13 = p->pObjs + iVar9;
          uVar17 = *(ulong *)pGVar13;
          uVar14 = (uint)uVar17;
          if ((-1 < (int)uVar14) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3a7,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          uVar15 = *(ulong *)(pGVar13 + -(ulong)(uVar14 & 0x1fffffff)) & 0x4000000040000000;
          if (uVar15 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3a8,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if (((uVar14 >> 0x1d & 1) == 0) || (uVar15 != 0x4000000000000000)) {
            if (uVar15 == 0x4000000000000000) {
              if ((uVar14 >> 0x1d & 1) != 0) goto LAB_0057a7eb;
LAB_0057a7e3:
              uVar17 = uVar17 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
            else {
              if (uVar15 == 0x40000000) {
                if ((uVar14 >> 0x1d & 1) != 0) goto LAB_0057a7e3;
                goto LAB_0057a7b9;
              }
LAB_0057a7eb:
              uVar17 = uVar17 | 0x4000000040000000;
            }
          }
          else {
LAB_0057a7b9:
            uVar17 = uVar17 & 0xbfffffffbfffffff | 0x40000000;
          }
          *(ulong *)pGVar13 = uVar17;
          lVar11 = lVar11 + 1;
          pVVar16 = p->vCos;
        } while (lVar11 < pVVar16->nSize);
        iVar9 = p->nObjs;
      }
      if ((0 < iVar9) && (pGVar13 = p->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
        lVar11 = 0;
        do {
          if ((~*(ulong *)pGVar13 & 0x4000000040000000) != 0) {
            iVar9 = pAVar4->nPis * iVar8 + pAVar4->nRegs + (int)lVar11;
            (&pAVar4[1].iPo)[iVar9 >> 5] = (&pAVar4[1].iPo)[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
            iVar9 = p->nObjs;
          }
          lVar11 = lVar11 + 1;
          pGVar13 = pGVar13 + 1;
        } while (lVar11 < iVar9);
      }
LAB_0057a869:
      bVar3 = iVar8 < pCex->iFrame;
      iVar8 = iVar8 + 1;
    } while (bVar3);
    iVar8 = p->nRegs;
  }
  uVar14 = pCex->iPo;
  if (pVVar16->nSize - iVar8 <= (int)uVar14) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar14) && ((int)uVar14 < pVVar16->nSize)) {
    iVar8 = pVVar16->pArray[uVar14];
    if ((-1 < (long)iVar8) && (iVar8 < p->nObjs)) {
      if (((undefined1  [12])p->pObjs[iVar8] & (undefined1  [12])0x4000000040000000) !=
          (undefined1  [12])0x4000000000000000) {
        __assert_fail("Gia_ObjTerSimGet1(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                      ,0x55,
                      "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)"
                     );
      }
      return pAVar4;
    }
LAB_0057a8e3:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0057a902:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Takes CEX and its care-set. Returns care-set of all objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Bmc_CexCareExtendToObjects( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k;
    assert( pCex->nPis == pCexCare->nPis );
    assert( pCex->nRegs == pCexCare->nRegs );
    assert( pCex->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( pCex->nRegs, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // initialize terminary simulation
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        // add cares to the exdended counter-example
        Gia_ManForEachObj( p, pObj, k )
            if ( !Gia_ObjTerSimGetX(pObj) )
                Abc_InfoSetBit( pNew->pData, pNew->nRegs + pNew->nPis * i + k );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Gia_ObjTerSimGet1(pObj) );
    return pNew;
}